

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
vertices_of_simplex(vector<int,_std::allocator<int>_> *__return_storage_ptr__,index_t simplex_index,
                   index_t dim,index_t n,binomial_coeff_table *binomial_coeff)

{
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  get_simplex_vertices<std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
            (simplex_index,dim,n,binomial_coeff,
             (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> vertices_of_simplex(const index_t simplex_index, const index_t dim, const index_t n,
                                         const binomial_coeff_table& binomial_coeff) {
	std::vector<index_t> vertices;
	get_simplex_vertices(simplex_index, dim, n, binomial_coeff, std::back_inserter(vertices));
	return vertices;
}